

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_loop.c
# Opt level: O0

void loop_subst_snap(jit_State *J,SnapShot *osnap,SnapEntry *loopmap,IRRef1 *subst)

{
  byte bVar1;
  byte bVar2;
  uint uVar3;
  uint uVar4;
  SnapEntry *pSVar5;
  SnapEntry *pSVar6;
  SnapEntry *pSVar7;
  uint local_7c;
  SnapEntry lsn;
  SnapEntry osn;
  SnapShot *snap;
  BCReg nslots;
  MSize onent;
  MSize nn;
  MSize ln;
  MSize on;
  MSize nmapofs;
  SnapEntry *nextmap;
  SnapEntry *omap;
  SnapEntry *nmap;
  IRRef1 *subst_local;
  SnapEntry *loopmap_local;
  SnapShot *osnap_local;
  jit_State *J_local;
  uint local_c;
  
  pSVar5 = (J->cur).snapmap;
  uVar3 = osnap->mapofs;
  pSVar6 = (J->cur).snapmap;
  if (osnap + 1 == (J->cur).snap + (J->cur).nsnap) {
    local_c = (J->cur).nsnapmap;
  }
  else {
    local_c = osnap[1].mapofs;
  }
  bVar1 = osnap->nent;
  bVar2 = osnap->nslots;
  _lsn = (J->cur).snap + (J->cur).nsnap;
  if (((J->guardemit).irt & 0x80) == 0) {
    _lsn = _lsn + -1;
    ln = _lsn->mapofs;
  }
  else {
    ln = (J->cur).nsnapmap;
    (J->cur).nsnap = (J->cur).nsnap + 1;
  }
  (J->guardemit).irt = '\0';
  _lsn->mapofs = ln;
  _lsn->ref = (IRRef1)(J->cur).nins;
  _lsn->mcofs = 0;
  _lsn->nslots = bVar2;
  _lsn->topslot = osnap->topslot;
  _lsn->count = '\0';
  pSVar7 = (J->cur).snapmap;
  nslots = 0;
  onent = 0;
  nn = 0;
  while (nn < bVar1) {
    local_7c = pSVar5[(ulong)uVar3 + (ulong)nn];
    uVar4 = loopmap[onent];
    if (uVar4 >> 0x18 < local_7c >> 0x18) {
      pSVar7[(ulong)ln + (ulong)nslots] = uVar4;
      onent = onent + 1;
    }
    else {
      if (uVar4 >> 0x18 == local_7c >> 0x18) {
        onent = onent + 1;
      }
      if (0x7fff < (local_7c & 0xffff)) {
        local_7c = local_7c & 0xfffb0000 | (uint)subst[local_7c & 0xffff];
      }
      pSVar7[(ulong)ln + (ulong)nslots] = local_7c;
      nn = nn + 1;
    }
    nslots = nslots + 1;
  }
  while (loopmap[onent] >> 0x18 < (uint)bVar2) {
    pSVar7[(ulong)ln + (ulong)nslots] = loopmap[onent];
    nslots = nslots + 1;
    onent = onent + 1;
  }
  _lsn->nent = (uint8_t)nslots;
  nextmap = pSVar5 + (ulong)uVar3 + (ulong)(uint)bVar1;
  omap = pSVar7 + (ulong)ln + (ulong)nslots;
  while (nextmap < pSVar6 + local_c) {
    *omap = *nextmap;
    nextmap = nextmap + 1;
    omap = omap + 1;
  }
  (J->cur).nsnapmap = (uint32_t)((long)omap - (long)(J->cur).snapmap >> 2);
  return;
}

Assistant:

static void loop_subst_snap(jit_State *J, SnapShot *osnap,
			    SnapEntry *loopmap, IRRef1 *subst)
{
  SnapEntry *nmap, *omap = &J->cur.snapmap[osnap->mapofs];
  SnapEntry *nextmap = &J->cur.snapmap[snap_nextofs(&J->cur, osnap)];
  MSize nmapofs;
  MSize on, ln, nn, onent = osnap->nent;
  BCReg nslots = osnap->nslots;
  SnapShot *snap = &J->cur.snap[J->cur.nsnap];
  if (irt_isguard(J->guardemit)) {  /* Guard inbetween? */
    nmapofs = J->cur.nsnapmap;
    J->cur.nsnap++;  /* Add new snapshot. */
  } else {  /* Otherwise overwrite previous snapshot. */
    snap--;
    nmapofs = snap->mapofs;
  }
  J->guardemit.irt = 0;
  /* Setup new snapshot. */
  snap->mapofs = (uint32_t)nmapofs;
  snap->ref = (IRRef1)J->cur.nins;
  snap->mcofs = 0;
  snap->nslots = nslots;
  snap->topslot = osnap->topslot;
  snap->count = 0;
  nmap = &J->cur.snapmap[nmapofs];
  /* Substitute snapshot slots. */
  on = ln = nn = 0;
  while (on < onent) {
    SnapEntry osn = omap[on], lsn = loopmap[ln];
    if (snap_slot(lsn) < snap_slot(osn)) {  /* Copy slot from loop map. */
      nmap[nn++] = lsn;
      ln++;
    } else {  /* Copy substituted slot from snapshot map. */
      if (snap_slot(lsn) == snap_slot(osn)) ln++;  /* Shadowed loop slot. */
      if (!irref_isk(snap_ref(osn)))
	osn = snap_setref(osn, subst[snap_ref(osn)]);
      nmap[nn++] = osn;
      on++;
    }
  }
  while (snap_slot(loopmap[ln]) < nslots)  /* Copy remaining loop slots. */
    nmap[nn++] = loopmap[ln++];
  snap->nent = (uint8_t)nn;
  omap += onent;
  nmap += nn;
  while (omap < nextmap)  /* Copy PC + frame links. */
    *nmap++ = *omap++;
  J->cur.nsnapmap = (uint32_t)(nmap - J->cur.snapmap);
}